

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain.hpp
# Opt level: O2

void __thiscall
so_5::mchain_props::details::receive_actions_performer_t<so_5::details::handlers_bunch_t<1UL>_>::
handle_next(receive_actions_performer_t<so_5::details::handlers_bunch_t<1UL>_> *this,
           duration_t empty_timeout)

{
  abstract_message_chain_t *paVar1;
  anon_class_16_2_7f447b8b lambda;
  bool bVar2;
  extraction_status_t eVar3;
  demand_t extracted_demand;
  type_index tVar4;
  intrusive_ptr_t<so_5::message_t> iVar5;
  
  tVar4._M_target = (type_info *)&void::typeinfo;
  iVar5.m_obj = (message_t *)0x0;
  paVar1 = (this->m_params->m_chain).m_obj;
  eVar3 = (*(paVar1->super_abstract_message_box_t)._vptr_abstract_message_box_t[0xc])
                    (paVar1,&stack0xffffffffffffffd8,empty_timeout.__r);
  this->m_status = eVar3;
  if (eVar3 == chain_closed) {
    if ((this->m_params->super_mchain_bulk_processing_params_t<so_5::mchain_receive_params_t>).
        m_chain_closed_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
      lambda.this = (receive_actions_performer_t<so_5::details::handlers_bunch_t<1UL>_> *)
                    iVar5.m_obj;
      lambda.handler = (chain_closed_handler *)tVar4._M_target;
      so_5::details::
      invoke_noexcept_code<so_5::mchain_props::details::receive_actions_performer_t<so_5::details::handlers_bunch_t<1ul>>::handle_next(std::chrono::duration<long,std::ratio<1l,1000000000l>>)::_lambda()_1_>
                (lambda);
    }
  }
  else if (eVar3 == msg_extracted) {
    this->m_extracted_messages = this->m_extracted_messages + 1;
    bVar2 = so_5::details::handlers_bunch_t<1UL>::handle
                      (this->m_bunch,(type_index *)&stack0xffffffffffffffd8,
                       (intrusive_ptr_t<so_5::message_t> *)&stack0xffffffffffffffe0,event);
    if (bVar2) {
      this->m_handled_messages = this->m_handled_messages + 1;
    }
  }
  intrusive_ptr_t<so_5::message_t>::dismiss_object
            ((intrusive_ptr_t<so_5::message_t> *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

void
		handle_next( duration_t empty_timeout )
			{
				demand_t extracted_demand;
				m_status = m_params.chain()->extract(
						extracted_demand, empty_timeout );

				if( extraction_status_t::msg_extracted == m_status )
					{
						++m_extracted_messages;
						const bool handled = m_bunch.handle(
								extracted_demand.m_msg_type,
								extracted_demand.m_message_ref,
								extracted_demand.m_demand_type );
						if( handled )
							++m_handled_messages;
					}
				// Since v.5.5.17 we must check presence of chain-closed handler.
				// This handler must be used if chain is closed.
				else if( extraction_status_t::chain_closed == m_status )
					{
						if( const auto & handler = m_params.closed_handler() )
							so_5::details::invoke_noexcept_code(
								[&handler, this] {
									handler( m_params.chain() );
								} );
					}
			}